

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

sexp_conflict
sexp_set_current_effective_user_id_x_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0)

{
  undefined1 auVar1 [16];
  int iVar2;
  int *in_RCX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sexp_conflict res;
  int err;
  __uid_t local_48;
  __uid_t local_40;
  sexp_conflict local_38;
  sexp_conflict local_8;
  
  if ((((ulong)in_RCX & 1) == 1) || ((((ulong)in_RCX & 3) == 0 && (*in_RCX == 0xc)))) {
    if (((ulong)in_RCX & 1) == 1) {
      auVar1._8_8_ = (long)in_RCX >> 0x3f;
      auVar1._0_8_ = (ulong)in_RCX & 0xfffffffffffffffe;
      local_40 = SUB164(auVar1 / SEXT816(2),0);
    }
    else {
      if ((((ulong)in_RCX & 3) == 0) && (*in_RCX == 0xc)) {
        local_48 = (__uid_t)*(undefined8 *)(in_RCX + 6);
      }
      else {
        local_48 = 0;
      }
      local_40 = local_48;
    }
    iVar2 = seteuid(local_40);
    if (iVar2 == 0) {
      local_38 = (sexp_conflict)0x13e;
    }
    else {
      local_38 = (sexp_conflict)0x3e;
    }
    local_8 = local_38;
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,2,in_RCX);
  }
  return local_8;
}

Assistant:

sexp sexp_set_current_effective_user_id_x_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0) {
  int err = 0;
  sexp res;
  if (! sexp_exact_integerp(arg0))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg0);
  err = seteuid(sexp_uint_value(arg0));
  if (err) {
  res = SEXP_FALSE;
  } else {
  res = SEXP_TRUE;
  }
  return res;
}